

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setLevelSetVisibleQuantity
          (VolumeMeshVertexScalarQuantity *this,string *name)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  pointer pVVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rules;
  long in_RDI;
  ShaderProgram *in_stack_00000068;
  VolumeMesh *in_stack_00000070;
  ShaderProgram *in_stack_00000138;
  VolumeMeshVertexScalarQuantity *in_stack_00000140;
  VolumeMeshVertexScalarQuantity *q;
  VolumeMeshQuantity *vmq;
  iterator pair;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>_>
  *in_stack_fffffffffffffdd8;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffde0;
  VolumeMesh *in_stack_fffffffffffffde8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf0;
  allocator_type *in_stack_fffffffffffffe08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  iterator in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  Engine *in_stack_fffffffffffffe28;
  string *local_1b8;
  ScalarQuantity<polyscope::VolumeMeshScalarQuantity> *this_00;
  VolumeMeshVertexScalarQuantity *p;
  VolumeMeshVertexScalarQuantity *this_01;
  VolumeMeshVertexScalarQuantity *local_170;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  ScalarQuantity<polyscope::VolumeMeshScalarQuantity> *mat;
  ShaderProgram *in_stack_fffffffffffffed8;
  VolumeMeshScalarQuantity *in_stack_fffffffffffffee0;
  undefined1 *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_100 [5];
  string local_b0 [14];
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff60;
  VolumeMesh *in_stack_ffffffffffffff68;
  undefined1 local_90 [47];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  ShaderProgram *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>_>
       ::find(in_stack_fffffffffffffdd8,(key_type *)0x4da3ea);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>_>
       ::end(in_stack_fffffffffffffdd8);
  bVar1 = std::operator==(local_18,&local_20);
  if (!bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>
                  *)in_stack_fffffffffffffde0);
    pVVar2 = std::
             unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>
             ::get((unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>
                    *)in_stack_fffffffffffffde0);
    if (pVVar2 == (pointer)0x0) {
      local_170 = (VolumeMeshVertexScalarQuantity *)0x0;
    }
    else {
      local_170 = (VolumeMeshVertexScalarQuantity *)
                  __dynamic_cast(pVVar2,&VolumeMeshQuantity::typeinfo,&typeinfo,0);
    }
    if (local_170 != (VolumeMeshVertexScalarQuantity *)0x0) {
      this_01 = render::engine;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"SLICE_TETS",&local_61);
      p = render::engine;
      VolumeMesh::getMaterial_abi_cxx11_(in_stack_fffffffffffffde8);
      rules = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RDI + 0x1a0);
      local_132 = 1;
      this_00 = (ScalarQuantity<polyscope::VolumeMeshScalarQuantity> *)&stack0xfffffffffffffed8;
      mat = this_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this_00,"SLICE_TETS_PROPAGATE_VALUE",&local_131);
      local_132 = 0;
      local_108 = &stack0xfffffffffffffed8;
      local_100[0]._M_allocated_capacity = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x4da5e7);
      __l._M_len = (size_type)in_stack_fffffffffffffe20;
      __l._M_array = in_stack_fffffffffffffe18;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffe10,__l,in_stack_fffffffffffffe08);
      ScalarQuantity<polyscope::VolumeMeshScalarQuantity>::addScalarRules(this_00,rules);
      VolumeMesh::addVolumeMeshRules
                (in_stack_ffffffffffffff68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff60._M_pi,(bool)in_stack_ffffffffffffff5f,
                 (bool)in_stack_ffffffffffffff5e);
      render::Engine::addMaterialRules
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe18);
      (*(this_01->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
        super_QuantityS<polyscope::VolumeMesh>.super_Quantity._vptr_Quantity[0x2b])
                (local_40,this_01,local_60,local_90,0);
      std::shared_ptr<polyscope::render::ShaderProgram>::operator=
                ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffde0,
                 (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffdd8);
      std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
                ((shared_ptr<polyscope::render::ShaderProgram> *)0x4da6d3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffdf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffdf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffdf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffdf0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x4da714);
      local_1b8 = (string *)&local_108;
      do {
        local_1b8 = local_1b8 + -0x20;
        std::__cxx11::string::~string(local_1b8);
      } while (local_1b8 != (string *)&stack0xfffffffffffffed8);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::
      __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_fffffffffffffde0);
      VolumeMesh::fillSliceGeometryBuffers(in_stack_00000070,in_stack_00000068);
      std::
      __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_fffffffffffffde0);
      fillSliceColorBuffers(local_170,in_stack_ffffffffffffffc8);
      std::
      __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_fffffffffffffde0);
      VolumeMesh::getMaterial_abi_cxx11_(in_stack_fffffffffffffde8);
      render::Engine::setMaterial
                ((Engine *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(string *)mat);
      std::__cxx11::string::~string(local_158);
      std::
      __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_fffffffffffffde0);
      fillLevelSetData(in_stack_00000140,in_stack_00000138);
      std::
      __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_fffffffffffffde0);
      setLevelSetUniforms(this_01,(ShaderProgram *)p);
      *(VolumeMeshVertexScalarQuantity **)(in_RDI + 0x4a8) = local_170;
    }
  }
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setLevelSetVisibleQuantity(std::string name) {
  auto pair = parent.quantities.find(name);
  if (pair == parent.quantities.end()) {
    return;
  }
  VolumeMeshQuantity* vmq = pair->second.get();
  VolumeMeshVertexScalarQuantity* q = dynamic_cast<VolumeMeshVertexScalarQuantity*>(vmq);
  if (q == nullptr) {
    return;
  }

  // clang-format off
  levelSetProgram = render::engine->requestShader("SLICE_TETS", 
      render::engine->addMaterialRules(parent.getMaterial(),
        parent.addVolumeMeshRules(
          addScalarRules(
            {"SLICE_TETS_PROPAGATE_VALUE"}), 
        true, true)
      )
    );
  // clang-format on

  // Fill color buffers
  parent.fillSliceGeometryBuffers(*levelSetProgram);
  q->fillSliceColorBuffers(*levelSetProgram);
  render::engine->setMaterial(*levelSetProgram, parent.getMaterial());
  fillLevelSetData(*levelSetProgram);
  setLevelSetUniforms(*levelSetProgram);
  showQuantity = q;
}